

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getOutputMatrix(FastText *this)

{
  element_type *peVar1;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *in_RSI;
  shared_ptr<const_fasttext::DenseMatrix> sVar4;
  
  if (((char)in_RSI[0xd] == '\x01') && (*(char *)(*in_RSI + 0xd1) == '\x01')) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (element_type *)in_RSI[6];
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("output_.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/fasttext.cc"
                  ,0x4c,
                  "std::shared_ptr<const DenseMatrix> fasttext::FastText::getOutputMatrix() const");
  }
  if ((undefined **)(peVar1->input)._M_dataplus._M_p != &PTR__DenseMatrix_0013f600) {
    peVar1 = (element_type *)0x0;
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(element_type *)0x0;
  if ((peVar1 != (element_type *)0x0) &&
     (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[7],
     _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1,
     p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  sVar4.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_fasttext::DenseMatrix>)
         sVar4.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getOutputMatrix() const {
  if (quant_ && args_->qout) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(output_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(output_);
}